

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::compare(bigint *lhs,bigint *rhs)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  uVar7 = (lhs->bigits_).super_buffer<unsigned_int>.size_;
  uVar9 = (rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar4 = (int)uVar7;
  iVar6 = lhs->exp_ + iVar4;
  iVar10 = (int)uVar9;
  iVar8 = rhs->exp_ + iVar10;
  if (iVar6 == iVar8) {
    uVar7 = uVar7 & 0xffffffff;
    uVar5 = iVar4 - iVar10;
    uVar9 = uVar9 & 0xffffffff;
    do {
      if ((int)uVar7 <= (int)(~((int)uVar5 >> 0x1f) & uVar5)) {
        if (uVar7 == uVar9) {
          return 0;
        }
        bVar3 = (int)uVar9 < (int)uVar7;
        goto LAB_00121675;
      }
      if ((int)uVar9 < 1) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                    ,0x146,"negative value");
      }
      uVar1 = (lhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar7 - 1];
      uVar2 = (rhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar9 - 1];
      uVar9 = uVar9 - 1;
      uVar7 = uVar7 - 1;
    } while (uVar1 == uVar2);
    uVar5 = (uVar2 < uVar1) - 1 | 1;
  }
  else {
    bVar3 = iVar8 < iVar6;
LAB_00121675:
    uVar5 = (uint)bVar3 * 2 - 1;
  }
  return uVar5;
}

Assistant:

int compare(const bigint& lhs, const bigint& rhs) {
    int num_lhs_bigits = lhs.num_bigits(), num_rhs_bigits = rhs.num_bigits();
    if (num_lhs_bigits != num_rhs_bigits)
      return num_lhs_bigits > num_rhs_bigits ? 1 : -1;
    int i = static_cast<int>(lhs.bigits_.size()) - 1;
    int j = static_cast<int>(rhs.bigits_.size()) - 1;
    int end = i - j;
    if (end < 0) end = 0;
    for (; i >= end; --i, --j) {
      bigit lhs_bigit = lhs[i], rhs_bigit = rhs[j];
      if (lhs_bigit != rhs_bigit) return lhs_bigit > rhs_bigit ? 1 : -1;
    }
    if (i != j) return i > j ? 1 : -1;
    return 0;
  }